

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DelayControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DelayControl,slang::ast::Expression_const&,slang::SourceRange_const&>
          (BumpAllocator *this,Expression *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  DelayControl *pDVar3;
  
  pDVar3 = (DelayControl *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DelayControl *)this->endPtr < pDVar3 + 1) {
    pDVar3 = (DelayControl *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pDVar3 + 1);
  }
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  (pDVar3->super_TimingControl).kind = Delay;
  (pDVar3->super_TimingControl).syntax = (SyntaxNode *)0x0;
  (pDVar3->super_TimingControl).sourceRange.startLoc = SVar1;
  (pDVar3->super_TimingControl).sourceRange.endLoc = SVar2;
  pDVar3->expr = args;
  return pDVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }